

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestList.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1fffe::TestAddingSecondTestAddsItToEndOfList::RunImpl
          (TestAddingSecondTestAddsItToEndOfList *this)

{
  TestResults *pTVar1;
  bool bVar2;
  Test *pTVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  TestDetails local_140 [2];
  TestDetails local_100 [2];
  TestDetails local_c0;
  undefined1 local_a0 [8];
  TestList list;
  undefined1 local_80 [8];
  Test test2;
  Test test1;
  TestAddingSecondTestAddsItToEndOfList *this_local;
  
  UnitTest::Test::Test((Test *)&test2.m_timeConstraintExempt,"test1","DefaultSuite","",0);
  UnitTest::Test::Test((Test *)local_80,"test2","DefaultSuite","",0);
  UnitTest::TestList::TestList((TestList *)local_a0);
  UnitTest::TestList::Add((TestList *)local_a0,(Test *)&test2.m_timeConstraintExempt);
  UnitTest::TestList::Add((TestList *)local_a0,(Test *)local_80);
  pTVar3 = UnitTest::TestList::GetHead((TestList *)local_a0);
  bVar2 = UnitTest::Check<bool>(pTVar3 == (Test *)&test2.m_timeConstraintExempt);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_c0,*ppTVar5,0x22);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_c0,"list.GetHead() == &test1");
  }
  bVar2 = UnitTest::Check<bool>((undefined1 *)test1.m_details._24_8_ == local_80);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_100,*ppTVar5,0x23);
    UnitTest::TestResults::OnTestFailure(pTVar1,local_100,"test1.next == &test2");
  }
  bVar2 = UnitTest::Check<bool>(test2.m_details._24_8_ == 0);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_140,*ppTVar5,0x24);
    UnitTest::TestResults::OnTestFailure(pTVar1,local_140,"test2.next == 0");
  }
  UnitTest::Test::~Test((Test *)local_80);
  UnitTest::Test::~Test((Test *)&test2.m_timeConstraintExempt);
  return;
}

Assistant:

TEST (AddingSecondTestAddsItToEndOfList)
{
    Test test1("test1");
    Test test2("test2");

    TestList list;
    list.Add(&test1);
    list.Add(&test2);

    CHECK (list.GetHead() == &test1);
    CHECK (test1.next == &test2);
    CHECK (test2.next == 0);
}